

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O3

void Abc_NtkPartitionCompact(Vec_Ptr_t *vPartsAll,Vec_Ptr_t *vPartSuppsAll,int nSuppSizeLimit)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  int *__dest;
  int iVar6;
  uint uVar7;
  Vec_Int_t *vArr1;
  size_t __size;
  long lVar8;
  Vec_Int_t *vArr1_00;
  
  iVar3 = 200;
  if (nSuppSizeLimit != 0) {
    iVar3 = nSuppSizeLimit;
  }
  if (vPartSuppsAll->nSize < 1) {
    uVar7 = 0;
  }
  else {
    lVar8 = 0;
    uVar7 = 0;
    vArr1 = (Vec_Int_t *)0x0;
    vArr1_00 = (Vec_Int_t *)0x0;
    do {
      pVVar5 = (Vec_Int_t *)vPartSuppsAll->pArray[lVar8];
      iVar6 = pVVar5->nSize;
      if (iVar6 < iVar3) {
        if (vArr1_00 == (Vec_Int_t *)0x0) {
          if (vArr1 != (Vec_Int_t *)0x0) {
            __assert_fail("vPart == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                          ,0x29b,"void Abc_NtkPartitionCompact(Vec_Ptr_t *, Vec_Ptr_t *, int)");
          }
          pVVar4 = (Vec_Int_t *)malloc(0x10);
          pVVar4->nSize = iVar6;
          pVVar4->nCap = iVar6;
          if (iVar6 == 0) {
            __size = 0;
            __dest = (int *)0x0;
          }
          else {
            __size = (long)iVar6 << 2;
            __dest = (int *)malloc(__size);
          }
          pVVar4->pArray = __dest;
          memcpy(__dest,pVVar5->pArray,__size);
          if (vPartsAll->nSize <= lVar8) goto LAB_002eaefd;
          pVVar5 = (Vec_Int_t *)vPartsAll->pArray[lVar8];
        }
        else {
          pVVar4 = Vec_IntTwoMerge(vArr1_00,pVVar5);
          if (vArr1_00->pArray != (int *)0x0) {
            free(vArr1_00->pArray);
          }
          free(vArr1_00);
          if (vPartsAll->nSize <= lVar8) goto LAB_002eaefd;
          pVVar5 = Vec_IntTwoMerge(vArr1,(Vec_Int_t *)vPartsAll->pArray[lVar8]);
          if (vArr1->pArray != (int *)0x0) {
            free(vArr1->pArray);
          }
          free(vArr1);
          if (vPartsAll->nSize <= lVar8) goto LAB_002eaefd;
          pvVar1 = vPartsAll->pArray[lVar8];
          pvVar2 = *(void **)((long)pvVar1 + 8);
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
          free(pvVar1);
          iVar6 = pVVar4->nSize;
        }
        vArr1_00 = pVVar4;
        if (iVar3 <= iVar6) goto LAB_002eaded;
      }
      else {
        if (vPartsAll->nSize <= lVar8) goto LAB_002eaefd;
        pVVar5 = (Vec_Int_t *)vPartsAll->pArray[lVar8];
LAB_002eaded:
        if (((int)uVar7 < 0) || (vPartsAll->nSize <= (int)uVar7)) goto LAB_002eaede;
        vPartsAll->pArray[uVar7] = pVVar5;
        if (vArr1_00 != (Vec_Int_t *)0x0) {
          if (vPartSuppsAll->nSize <= (int)uVar7) goto LAB_002eaefd;
          pvVar1 = vPartSuppsAll->pArray[uVar7];
          pvVar2 = *(void **)((long)pvVar1 + 8);
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
          free(pvVar1);
          if (vPartSuppsAll->nSize <= (int)uVar7) goto LAB_002eaede;
          vPartSuppsAll->pArray[uVar7] = vArr1_00;
        }
        uVar7 = uVar7 + 1;
        pVVar5 = (Vec_Int_t *)0x0;
        pVVar4 = (Vec_Int_t *)0x0;
      }
      lVar8 = lVar8 + 1;
      iVar6 = vPartSuppsAll->nSize;
      vArr1 = pVVar5;
      vArr1_00 = pVVar4;
    } while (lVar8 < iVar6);
    if (pVVar5 != (Vec_Int_t *)0x0) {
      if ((-1 < (int)uVar7) && ((int)uVar7 < vPartsAll->nSize)) {
        vPartsAll->pArray[uVar7] = pVVar5;
        if (pVVar4 == (Vec_Int_t *)0x0) {
          __assert_fail("vPartSupp != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                        ,0x2bd,"void Abc_NtkPartitionCompact(Vec_Ptr_t *, Vec_Ptr_t *, int)");
        }
        if (iVar6 <= (int)uVar7) {
LAB_002eaefd:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar1 = vPartSuppsAll->pArray[uVar7];
        pvVar2 = *(void **)((long)pvVar1 + 8);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
        free(pvVar1);
        if ((int)uVar7 < vPartSuppsAll->nSize) {
          vPartSuppsAll->pArray[uVar7] = pVVar4;
          uVar7 = uVar7 + 1;
          goto LAB_002eaec7;
        }
      }
LAB_002eaede:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
    }
  }
LAB_002eaec7:
  if ((int)uVar7 <= vPartsAll->nSize) {
    vPartsAll->nSize = uVar7;
    return;
  }
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
}

Assistant:

void Abc_NtkPartitionCompact( Vec_Ptr_t * vPartsAll, Vec_Ptr_t * vPartSuppsAll, int nSuppSizeLimit )
{
    Vec_Int_t * vOne, * vPart, * vPartSupp, * vTemp;
    int i, iPart;

    if ( nSuppSizeLimit == 0 )
        nSuppSizeLimit = 200;

    // pack smaller partitions into larger blocks
    iPart = 0;
    vPart = vPartSupp = NULL;
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
    {
        if ( Vec_IntSize(vOne) < nSuppSizeLimit )
        {
            if ( vPartSupp == NULL )
            {
                assert( vPart == NULL );
                vPartSupp = Vec_IntDup(vOne);
                vPart = (Vec_Int_t *)Vec_PtrEntry(vPartsAll, i);
            }
            else
            {
                vPartSupp = Vec_IntTwoMerge( vTemp = vPartSupp, vOne );
                Vec_IntFree( vTemp );
                vPart = Vec_IntTwoMerge( vTemp = vPart, (Vec_Int_t *)Vec_PtrEntry(vPartsAll, i) );
                Vec_IntFree( vTemp );
                Vec_IntFree( (Vec_Int_t *)Vec_PtrEntry(vPartsAll, i) );
            }
            if ( Vec_IntSize(vPartSupp) < nSuppSizeLimit )
                continue;
        }
        else
            vPart = (Vec_Int_t *)Vec_PtrEntry(vPartsAll, i);
        // add the partition 
        Vec_PtrWriteEntry( vPartsAll, iPart, vPart );  
        vPart = NULL;
        if ( vPartSupp ) 
        {
            Vec_IntFree( (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll, iPart) );
            Vec_PtrWriteEntry( vPartSuppsAll, iPart, vPartSupp );  
            vPartSupp = NULL;
        }
        iPart++;
    }
    // add the last one
    if ( vPart )
    {
        Vec_PtrWriteEntry( vPartsAll, iPart, vPart );  
        vPart = NULL;

        assert( vPartSupp != NULL );
        Vec_IntFree( (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll, iPart) );
        Vec_PtrWriteEntry( vPartSuppsAll, iPart, vPartSupp );  
        vPartSupp = NULL;
        iPart++;
    }
    Vec_PtrShrink( vPartsAll, iPart );
    Vec_PtrShrink( vPartsAll, iPart );
}